

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_closefile(LispPTR *args)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *lf_cp;
  LispPTR *pLVar5;
  long lVar6;
  char *host_00;
  int *piVar7;
  long lVar8;
  DLword *pDVar9;
  LispPTR LVar10;
  LispPTR LVar11;
  timespec timesp [2];
  stat sbuf;
  char host [255];
  char lfname [4101];
  char file [4096];
  
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
  pLVar5 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar5 + 6) == 'D') {
    iVar3 = pLVar5[2] * 2 + 5;
  }
  else {
    if (*(char *)((long)pLVar5 + 6) != 'C') {
      error("LispStringLength: Not a character array.\n");
      goto LAB_00118e3e;
    }
    iVar3 = pLVar5[2] + 3;
  }
  if (0x1005 < iVar3) {
    *Lisp_errno = 200;
    return 0;
  }
LAB_00118e3e:
  pLVar5 = NativeAligned4FromLAddr(*args);
  LVar10 = 0x1000;
  if ((int)pLVar5[2] < 0x1000) {
    LVar10 = pLVar5[2];
  }
  lVar6 = (long)(int)LVar10;
  if (*(char *)((long)pLVar5 + 6) == 'D') {
    pDVar9 = Lisp_world + (ulong)(ushort)pLVar5[1] + (ulong)(*pLVar5 & 0xfffffff);
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      lfname[lVar8] = *(char *)((ulong)pDVar9 ^ 2);
      pDVar9 = pDVar9 + 1;
    }
    lfname[lVar8] = '\0';
  }
  else if (*(char *)((long)pLVar5 + 6) == 'C') {
    uVar2 = *pLVar5;
    LVar10 = pLVar5[1];
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      lfname[lVar8] =
           *(char *)((long)Lisp_world +
                     lVar8 + (ulong)(ushort)LVar10 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
    }
    lfname[lVar6] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  host_00 = host;
  separate_host(lfname,host_00);
  for (; cVar1 = *host_00, cVar1 != '\0'; host_00 = host_00 + 1) {
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      *host_00 = cVar1 + -0x20;
    }
  }
  if (host._0_4_ == 0x4b5344) {
    iVar3 = 1;
  }
  else {
    iVar4 = bcmp(host,"UNIX",5);
    iVar3 = 0;
    if (iVar4 != 0) {
      return 0;
    }
  }
  unixpathname(lfname,file,iVar3,0);
  uVar2 = args[1];
  if ((uVar2 & 0xfff0000) == 0xf0000) {
    LVar10 = uVar2 | 0xffff0000;
  }
  else if ((uVar2 & 0xfff0000) == 0xe0000) {
    LVar10 = uVar2 & 0xffff;
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(uVar2);
    LVar10 = *pLVar5;
  }
  uVar2 = args[2];
  if ((uVar2 & 0xfff0000) == 0xf0000) {
    LVar11 = uVar2 | 0xffff0000;
  }
  else if ((uVar2 & 0xfff0000) == 0xe0000) {
    LVar11 = uVar2 & 0xffff;
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(uVar2);
    LVar11 = *pLVar5;
  }
  if (host._0_4_ == 0x4b5344) {
LAB_00119041:
    if (LVar11 == 0) {
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        iVar3 = close(LVar10);
        if (iVar3 != -1) goto LAB_00119156;
      } while (*piVar7 == 4);
      alarm(0);
      iVar3 = *piVar7;
      if ((iVar3 == 1 && host._0_4_ != 0x4b5344) && ((sbuf.st_mode & 0xf000) != 0x8000)) {
        return 0x4c;
      }
    }
    else {
      timesp[0].tv_sec = sbuf.st_atim.tv_sec;
      timesp[0].tv_nsec = 0;
      timesp[1].tv_sec = (__time_t)(int)(LVar11 + 0xfe36b500);
      timesp[1].tv_nsec = 0;
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        iVar3 = futimens(LVar10,(timespec *)timesp);
        if (iVar3 != -1) break;
      } while (*piVar7 == 4);
      alarm(0);
      if (iVar3 == 0) {
        alarm(TIMEOUT_TIME);
        do {
          *piVar7 = 0;
          iVar3 = close(LVar10);
          if (iVar3 != -1) {
LAB_00119156:
            alarm(0);
            return 0x4c;
          }
        } while (*piVar7 == 4);
        alarm(0);
      }
      iVar3 = *piVar7;
    }
  }
  else {
    alarm(TIMEOUT_TIME);
    piVar7 = __errno_location();
    do {
      *piVar7 = 0;
      iVar3 = fstat(LVar10,(stat *)&sbuf);
      if (iVar3 != -1) {
        alarm(0);
        goto LAB_00119041;
      }
    } while (*piVar7 == 4);
    alarm(0);
    iVar3 = *piVar7;
  }
  *Lisp_errno = iVar3;
  return 0;
}

Assistant:

LispPTR COM_closefile(LispPTR *args)
{
#ifdef DOS

  int fd, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN], dir[MAXPATHLEN], name[MAXNAMLEN + 1];
  char ver[VERSIONLEN], drive[1];
  struct find_t dirp;
  int dp;
  struct stat sbuf;
  ino_t ino;
  int extlen;
  char rawname[MAXNAMLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);

  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host, drive);

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0, drive, &extlen, rawname)
       : unixpathname(lfname, file, 0, 0, drive, &extlen, rawname);
  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);
  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  if (!unpack_filename(file, dir, name, ver, 1)) return (NIL);

  if (dskp) {
    /*
     * On {DSK}, we have to make sure dir is case sensitively existing
     * directory.
     */
    if (true_name(dir) != -1) return (NIL);

    /*
     * There is a very troublesome problem here.  The file name Lisp
     * recognizes is not always the same as the name which COM_openfile
     * used to open the file.  Sometimes COM_openfile uses the versionless
     * file name to open a file, although Lisp always recognizes with
     * *versioned* file name.
     * Thus, we compare i-node number of the requested file with ones of all
     * of files on the directory.   This is time spending implementation.
     * More clean up work is needed.
     */
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
    ino = sbuf.st_ino;
    TIMEOUT(rval = _dos_findfirst(dir, _A_SUBDIR, &dirp));
    if (rval < 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

    for (; rval == 0; S_TOUT(rval = _dos_findnext(&dirp))) {
      sprintf(file, "%s\\%s", dir, dirp.name);
    }
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  time[0].tv_sec = (long)sbuf.st_atime;
  time[0].tv_usec = 0L;
  time[1].tv_sec = (long)ToUnixTime(cdate);
  time[1].tv_usec = 0L;
#endif /* DOS */
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  TIMEOUT(rval = utimes(file, time));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
#endif /* DOS, internal */
#else  /* UNIX version of CLOSEFILE */
  int fd, fatp, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN];
  struct stat sbuf;
  struct timespec timesp[2];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host);
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0) : unixpathname(lfname, file, 0, 0);

  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);

  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  /* introduction of futimens() allows us to set the times on an open
   * file descriptor so a lot of directory manipulation to find the
   * appropriate name associated with the inode is no longer required
   */

  timesp[0].tv_sec = (long)sbuf.st_atime;
  timesp[0].tv_nsec = 0L;
  timesp[1].tv_sec = (long)ToUnixTime(cdate);
  timesp[1].tv_nsec = 0L;

  TIMEOUT(rval = futimens(fd, timesp));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

#endif /* DOS */

  return (ATOM_T);
}